

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbackingstore.cpp
# Opt level: O1

void __thiscall QBackingStore::endPaint(QBackingStore *this)

{
  QPaintDevice *pQVar1;
  QPlatformBackingStore *pQVar2;
  
  pQVar1 = paintDevice(this);
  if (pQVar1->painters != 0) {
    endPaint();
  }
  pQVar2 = handle(this);
  (*pQVar2->_vptr_QPlatformBackingStore[0xb])(pQVar2);
  return;
}

Assistant:

void QBackingStore::endPaint()
{
    if (paintDevice()->paintingActive())
        qWarning("QBackingStore::endPaint() called with active painter; did you forget to destroy it or call QPainter::end() on it?");

    handle()->endPaint();
}